

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-md5.c
# Opt level: O0

void p_crypto_hash_md5_finish(PHashMD5 *ctx)

{
  puint32 pVar1;
  puint32 pVar2;
  uint uVar3;
  int local_24;
  pint last;
  pint left;
  puint32 low;
  puint32 high;
  PHashMD5 *ctx_local;
  
  uVar3 = ctx->len_low & 0x3f;
  if (uVar3 < 0x38) {
    local_24 = 0x38 - uVar3;
  }
  else {
    local_24 = 0x78 - uVar3;
  }
  pVar1 = ctx->len_low;
  pVar2 = ctx->len_high;
  uVar3 = ctx->len_low;
  if (0 < local_24) {
    p_crypto_hash_md5_update(ctx,pp_crypto_hash_md5_pad,(long)local_24);
  }
  (ctx->buf).buf_w[0xe] = pVar1 << 3;
  (ctx->buf).buf_w[0xf] = pVar2 << 3 | uVar3 >> 0x1d;
  pp_crypto_hash_md5_swap_bytes((puint32 *)ctx,0xe);
  pp_crypto_hash_md5_process(ctx,(puint32 *)ctx);
  pp_crypto_hash_md5_swap_bytes(ctx->hash,4);
  return;
}

Assistant:

void
p_crypto_hash_md5_finish (PHashMD5 *ctx)
{
	puint32	high;
	puint32	low;
	pint	left;
	pint	last;

	left = ctx->len_low & 0x3F;
	last = (left < 56) ? (56 - left) : (120 - left);

	low = ctx->len_low << 3;
	high = ctx->len_high << 3
	     | ctx->len_low >> 29;

	if (last > 0)
		p_crypto_hash_md5_update (ctx, pp_crypto_hash_md5_pad, (psize) last);

	ctx->buf.buf_w[14] = low;
	ctx->buf.buf_w[15] = high;

	pp_crypto_hash_md5_swap_bytes (ctx->buf.buf_w, 14);
	pp_crypto_hash_md5_process (ctx, ctx->buf.buf_w);

	pp_crypto_hash_md5_swap_bytes (ctx->hash, 4);
}